

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader15.cpp
# Opt level: O1

void __thiscall COLLADASaxFWL::FormulasLoader15::begin__arccos(FormulasLoader15 *this)

{
  arccos__AttributeData *in_RSI;
  
  begin__arccos((FormulasLoader15 *)&this[-1].super_IParserImpl15.super_ColladaParserAutoGen15,
                in_RSI);
  return;
}

Assistant:

bool FormulasLoader15::begin__arccos( const COLLADASaxFWL15::arccos__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__arccos(attributeData));
COLLADASaxFWL::arccos__AttributeData attrData;
attrData.style = attributeData.style;
attrData.xref = attributeData.xref;
attrData.id = attributeData.id;
attrData.encoding = attributeData.encoding;
attrData.unknownAttributes = attributeData.unknownAttributes;
attrData.present_attributes = 0;
if ( (attributeData.present_attributes & COLLADASaxFWL15::arccos__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT) == COLLADASaxFWL15::arccos__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT ) {
    attrData.definitionURL = attributeData.definitionURL;
    attrData.present_attributes |= COLLADASaxFWL::arccos__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL15::arccos__AttributeData::ATTRIBUTE__CLASS_PRESENT) == COLLADASaxFWL15::arccos__AttributeData::ATTRIBUTE__CLASS_PRESENT ) {
    attrData._class = attributeData._class;
    attrData.present_attributes |= COLLADASaxFWL::arccos__AttributeData::ATTRIBUTE__CLASS_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL15::arccos__AttributeData::ATTRIBUTE_HREF_PRESENT) == COLLADASaxFWL15::arccos__AttributeData::ATTRIBUTE_HREF_PRESENT ) {
    attrData.href = attributeData.href;
    attrData.present_attributes |= COLLADASaxFWL::arccos__AttributeData::ATTRIBUTE_HREF_PRESENT;
}
return mLoader->begin__arccos(attrData);
}